

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O0

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CByIndexExpression *exp)

{
  bool bVar1;
  pointer pIVar2;
  TypeInfo local_168;
  TypeInfo local_140;
  CError local_118;
  TypeInfo local_e8;
  undefined1 local_c0 [8];
  string errorMessage;
  TypeInfo local_a0;
  TypeInfo local_78;
  TypeInfo local_40;
  CByIndexExpression *local_18;
  CByIndexExpression *exp_local;
  CTypeCheckerVisitor *this_local;
  
  local_18 = exp;
  exp_local = (CByIndexExpression *)this;
  std::operator<<((ostream *)&std::cout,"typechecker: CByIndexExpression\n");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->identifier);
  if (bVar1) {
    pIVar2 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                       (&local_18->identifier);
    (**(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
    TypeInfo::TypeInfo(&local_40,ERROR_TYPE);
    bVar1 = ::operator==(&this->lastCalculatedType,&local_40);
    TypeInfo::~TypeInfo(&local_40);
    if (bVar1) {
      return;
    }
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->indexExpression);
  if (bVar1) {
    pIVar2 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                       (&local_18->indexExpression);
    (**(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
    TypeInfo::TypeInfo(&local_78,ERROR_TYPE);
    bVar1 = ::operator==(&this->lastCalculatedType,&local_78);
    TypeInfo::~TypeInfo(&local_78);
    if (bVar1) {
      return;
    }
  }
  TypeInfo::TypeInfo(&local_a0,INT);
  bVar1 = ::operator!=(&this->lastCalculatedType,&local_a0);
  TypeInfo::~TypeInfo(&local_a0);
  if (bVar1) {
    TypeInfo::TypeInfo(&local_e8,INT);
    CError::GetTypeErrorMessage_abi_cxx11_((CError *)local_c0,&local_e8,&this->lastCalculatedType);
    TypeInfo::~TypeInfo(&local_e8);
    CError::CError(&local_118,(string *)local_c0,
                   &(local_18->super_IExpression).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_118);
    CError::~CError(&local_118);
    TypeInfo::TypeInfo(&local_140,ERROR_TYPE);
    TypeInfo::operator=(&this->lastCalculatedType,&local_140);
    TypeInfo::~TypeInfo(&local_140);
    std::__cxx11::string::~string((string *)local_c0);
  }
  else {
    TypeInfo::TypeInfo(&local_168,INT);
    TypeInfo::operator=(&this->lastCalculatedType,&local_168);
    TypeInfo::~TypeInfo(&local_168);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CByIndexExpression &exp )
{
    std::cout << "typechecker: CByIndexExpression\n";

    if( exp.identifier) {
		exp.identifier->Accept( *this );
        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
	}
	if( exp.indexExpression ) {
		exp.indexExpression->Accept( *this );
        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
	}
	if( lastCalculatedType != enums::TPrimitiveType::INT ) {
		auto errorMessage = CError::GetTypeErrorMessage( enums::TPrimitiveType::INT, lastCalculatedType );
		errors.push_back( CError( errorMessage, exp.position ) );
        lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
        return;
	}
    lastCalculatedType = enums::TPrimitiveType::INT;
}